

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall
cmCPackeIFWUpdatesPatcher::CharacterDataHandler
          (cmCPackeIFWUpdatesPatcher *this,char *data,int length)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string content;
  int length_local;
  char *data_local;
  cmCPackeIFWUpdatesPatcher *this_local;
  
  content.field_2._12_4_ = length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_40,data,data + length,&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar2 = std::__cxx11::string::empty();
  if (((((uVar2 & 1) == 0) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40," "), !bVar1)) &&
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40,"  "), !bVar1)) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"\n"), !bVar1)) {
    cmXMLWriter::Content<std::__cxx11::string>
              (this->xout,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) override
  {
    std::string content(data, data + length);
    if (content.empty() || content == " " || content == "  " ||
        content == "\n") {
      return;
    }
    this->xout.Content(content);
  }